

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

JsValueRef
WScriptJsrt::GetReportCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  JsErrorCode JVar3;
  RuntimeThreadLocalData *pRVar4;
  undefined2 in_register_0000000a;
  size_type *local_50;
  value_type str;
  JsValueRef returnValue;
  
  str.field_2._8_8_ = 0;
  JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetNullValue)
                    ((JsValueRef *)((long)&str.field_2 + 8));
  if ((CONCAT22(in_register_0000000a,argumentCount) != 0) && (JVar3 == JsNoError)) {
    pRVar4 = GetRuntimeThreadLocalData();
    if (pRVar4->threadData != (RuntimeThreadData *)0x0) {
      EnterCriticalSection(&pRVar4->threadData->csReportQ);
      if ((pRVar4->threadData->reportQ).
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size != 0) {
        p_Var1 = (pRVar4->threadData->reportQ).
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 = p_Var1[1]._M_next;
        local_50 = &str._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,p_Var2,(long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var2);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&pRVar4->threadData->reportQ,
                   (pRVar4->threadData->reportQ).
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next);
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                  ((char *)local_50,(size_t)str._M_dataplus._M_p,
                   (JsValueRef *)((long)&str.field_2 + 8));
        if (local_50 != &str._M_string_length) {
          operator_delete(local_50);
        }
      }
      LeaveCriticalSection(&pRVar4->threadData->csReportQ);
    }
  }
  return (JsValueRef)str.field_2._8_8_;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::GetReportCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetNullValue(&returnValue));

    if (argumentCount > 0)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            EnterCriticalSection(&threadData->csReportQ);

            if (threadData->reportQ.size() > 0)
            {
                auto str = threadData->reportQ.front();
                threadData->reportQ.pop_front();
                ChakraRTInterface::JsCreateString(str.c_str(), str.size(), &returnValue);
            }
            LeaveCriticalSection(&threadData->csReportQ);
        }
    }

Error:
    return returnValue;
}